

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_b4327e::X509Test_TestFromBufferReused_Test::TestBody
          (X509Test_TestFromBufferReused_Test *this)

{
  uint8_t *puVar1;
  size_t sVar2;
  _Head_base<0UL,_x509_st_*,_false> a;
  _Head_base<0UL,_unsigned_char_*,_false> orig_ptr;
  bool bVar3;
  int iVar4;
  uint8_t *puVar5;
  size_t sVar6;
  uintptr_t b_u;
  pointer *__ptr;
  char *pcVar7;
  char *in_R9;
  pointer *__ptr_2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  UniquePtr<X509> root;
  UniquePtr<CRYPTO_BUFFER> buf;
  X509 *raw;
  UniquePtr<uint8_t> data2;
  size_t data2_len;
  uint8_t *i2d;
  int i2d_len;
  UniquePtr<uint8_t> data;
  UniquePtr<uint8_t> i2d_storage;
  X509 *ret;
  size_t data_len;
  uint8_t *inp;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Head_base<0UL,_x509_st_*,_false> local_80;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_78;
  AssertHelper local_70;
  _Head_base<0UL,_unsigned_char_*,_false> local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  int local_4c;
  AssertHelper local_48;
  __uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter> local_40;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_38;
  X509 *local_30;
  size_t local_28;
  _Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter> local_20;
  
  local_40._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_bssl::internal::Deleter>)
       (_Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>)0x0;
  bVar3 = PEMToDER((UniquePtr<uint8_t> *)&local_40,&local_28,
                   "\n-----BEGIN CERTIFICATE-----\nMIICVTCCAb6gAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwLjEaMBgGA1UE\nChMRQm9yaW5nU1NMIFRFU1RJTkcxEDAOBgNVBAMTB1Jvb3QgQ0EwIBcNMTUwMTAx\nMDAwMDAwWhgPMjEwMDAxMDEwMDAwMDBaMC4xGjAYBgNVBAoTEUJvcmluZ1NTTCBU\nRVNUSU5HMRAwDgYDVQQDEwdSb290IENBMIGfMA0GCSqGSIb3DQEBAQUAA4GNADCB\niQKBgQDpDn8RDOZa5oaDcPZRBy4CeBH1siSSOO4mYgLHlPE+oXdqwI/VImi2XeJM\n2uCFETXCknJJjYG0iJdrt/yyRFvZTQZw+QzGj+mz36NqhGxDWb6dstB2m8PX+plZ\nw7jl81MDvUnWs8yiQ/6twgu5AbhWKZQDJKcNKCEpqa6UW0r5nwIDAQABo3oweDAO\nBgNVHQ8BAf8EBAMCAgQwHQYDVR0lBBYwFAYIKwYBBQUHAwEGCCsGAQUFBwMCMA8G\nA1UdEwEB/wQFMAMBAf8wGQYDVR0OBBIEEEA31wH7QC+4HH5UBCeMWQEwGwYDVR0j\nBBQwEoAQQDfXAftAL7gcflQEJ4xZATANBgkqhkiG9w0BAQsFAAOBgQDXylEK77Za\nkKeY6ZerrScWyZhrjIGtHFu09qVpdJEzrk87k2G7iHHR9CAvSofCgEExKtWNS9dN\n+9WiZp/U48iHLk7qaYXdEuO07No4BYtXn+lkOykE+FUxmA4wvOF1cTd2tdj3MzX2\nkfGIBAYhzGZWhY3JbhIfTEfY1PNM1pWChQ==\n-----END CERTIFICATE-----\n"
                  );
  local_b0._M_head_impl._0_1_ = bVar3;
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)&local_b0,
               (AssertionResult *)"PEMToDER(&data, &data_len, kRootCAPEM)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xa5b,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_a0._1_7_,local_a0[0]),local_90._M_allocated_capacity + 1);
    }
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    if (!bVar3) goto LAB_003c5922;
  }
  local_78._M_head_impl =
       CRYPTO_BUFFER_new((uint8_t *)
                         local_40._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,local_28,
                         (CRYPTO_BUFFER_POOL *)0x0);
  local_b0._M_head_impl._0_1_ = local_78._M_head_impl != (CRYPTO_BUFFER *)0x0;
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_78._M_head_impl == (CRYPTO_BUFFER *)0x0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)&local_b0,(AssertionResult *)0x581a9f,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xa5f,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_a0._1_7_,local_a0[0]),local_90._M_allocated_capacity + 1);
    }
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
  }
  else {
    local_80._M_head_impl = X509_parse_from_buffer(local_78._M_head_impl);
    local_b0._M_head_impl._0_1_ = local_80._M_head_impl != (X509 *)0x0;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_80._M_head_impl == (X509 *)0x0) {
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)&local_b0,(AssertionResult *)0x5c83c3,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xa62,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_a0._1_7_,local_a0[0]),local_90._M_allocated_capacity + 1);
      }
      if (local_b8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b8._M_head_impl + 8))();
      }
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
    }
    else {
      local_68._M_head_impl = (uchar *)0x0;
      bVar3 = PEMToDER((UniquePtr<uint8_t> *)&local_68,(size_t *)&local_60,
                       "\n-----BEGIN CERTIFICATE-----\nMIICXjCCAcegAwIBAgIIWjO48ufpunYwDQYJKoZIhvcNAQELBQAwNjEaMBgGA1UE\nChMRQm9yaW5nU1NMIFRFU1RJTkcxGDAWBgNVBAMTD0ludGVybWVkaWF0ZSBDQTAg\nFw0xNTAxMDEwMDAwMDBaGA8yMTAwMDEwMTAwMDAwMFowMjEaMBgGA1UEChMRQm9y\naW5nU1NMIFRFU1RJTkcxFDASBgNVBAMTC2V4YW1wbGUuY29tMIGfMA0GCSqGSIb3\nDQEBAQUAA4GNADCBiQKBgQDD0U0ZYgqShJ7oOjsyNKyVXEHqeafmk/bAoPqY/h1c\noPw2E8KmeqiUSoTPjG5IXSblOxcqpbAXgnjPzo8DI3GNMhAf8SYNYsoH7gc7Uy7j\n5x8bUrisGnuTHqkqH6d4/e7ETJ7i3CpR8bvK16DggEvQTudLipz8FBHtYhFakfdh\nTwIDAQABo3cwdTAOBgNVHQ8BAf8EBAMCBaAwHQYDVR0lBBYwFAYIKwYBBQUHAwEG\nCCsGAQUFBwMCMAwGA1UdEwEB/wQCMAAwGQYDVR0OBBIEEKN5pvbur7mlXjeMEYA0\n4nUwGwYDVR0jBBQwEoAQjBpoqLV2211Xex+NFLIGozANBgkqhkiG9w0BAQsFAAOB\ngQBj/p+JChp//LnXWC1k121LM/ii7hFzQzMrt70bny406SGz9jAjaPOX4S3gt38y\nrhjpPukBlSzgQXFg66y6q5qp1nQTD1Cw6NkKBe9WuBlY3iYfmsf7WT8nhlT1CttU\nxNCwyMX9mtdXdQicOfNjIGUCD5OLV5PgHFPRKiHHioBAhg==\n-----END CERTIFICATE-----\n"
                      );
      local_b0._M_head_impl._0_1_ = bVar3;
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar3) {
LAB_003c5205:
        puVar1 = ((local_80._M_head_impl)->cert_info->enc).enc;
        sVar2 = ((local_80._M_head_impl)->cert_info->enc).len;
        puVar5 = CRYPTO_BUFFER_data(local_78._M_head_impl);
        sVar6 = CRYPTO_BUFFER_len(local_78._M_head_impl);
        local_b0._M_head_impl._0_1_ = puVar1 < puVar5 + sVar6 && puVar5 < puVar1 + sVar2;
        local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (puVar1 >= puVar5 + sVar6 || puVar5 >= puVar1 + sVar2) {
          testing::Message::Message((Message *)&local_b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a0,(internal *)&local_b0,
                     (AssertionResult *)
                     "buffers_alias(root->cert_info->enc.enc, root->cert_info->enc.len, CRYPTO_BUFFER_data(buf.get()), CRYPTO_BUFFER_len(buf.get()))"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xa69,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_a0._1_7_,local_a0[0]),
                            local_90._M_allocated_capacity + 1);
          }
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a8,local_a8);
        }
        local_70.data_ = (AssertHelperData *)local_80._M_head_impl;
        local_80._M_head_impl = (x509_st *)0x0;
        local_20.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (_Head_base<0UL,_unsigned_char_*,_false>)
             (_Head_base<0UL,_unsigned_char_*,_false>)local_68._M_head_impl;
        local_30 = d2i_X509((X509 **)&local_70,(uchar **)&local_20,(long)local_60._M_head_impl);
        a._M_head_impl = local_80._M_head_impl;
        local_80._M_head_impl = (x509_st *)local_70.data_;
        if ((X509 *)a._M_head_impl != (X509 *)0x0) {
          X509_free((X509 *)a._M_head_impl);
        }
        local_b0._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_80._M_head_impl;
        testing::internal::CmpHelperEQ<x509_st*,x509_st*>
                  ((internal *)local_a0,"root.get()","ret",(x509_st **)&local_b0,
                   (x509_st **)&local_30);
        if (local_a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b0);
          if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar7 = "";
          }
          else {
            pcVar7 = (local_98->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xa75,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_b0)
          ;
        }
        else {
          if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_98,local_98);
          }
          local_b0._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((local_80._M_head_impl)->cert_info->enc).buf;
          local_b8._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperEQ<crypto_buffer_st*,crypto_buffer_st*>
                    ((internal *)local_a0,"nullptr","root->cert_info->enc.buf",
                     (crypto_buffer_st **)&local_b8,(crypto_buffer_st **)&local_b0);
          if (local_a0[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_b0);
            if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar7 = "";
            }
            else {
              pcVar7 = (local_98->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0xa76,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_b8,(Message *)&local_b0);
          }
          else {
            if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_98,local_98);
            }
            puVar1 = ((local_80._M_head_impl)->cert_info->enc).enc;
            sVar2 = ((local_80._M_head_impl)->cert_info->enc).len;
            puVar5 = CRYPTO_BUFFER_data(local_78._M_head_impl);
            sVar6 = CRYPTO_BUFFER_len(local_78._M_head_impl);
            local_b0._M_head_impl._0_1_ = puVar5 + sVar6 <= puVar1 || puVar1 + sVar2 <= puVar5;
            local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (puVar5 + sVar6 > puVar1 && puVar1 + sVar2 > puVar5) {
              testing::Message::Message((Message *)&local_b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_a0,(internal *)&local_b0,
                         (AssertionResult *)
                         "buffers_alias(root->cert_info->enc.enc, root->cert_info->enc.len, CRYPTO_BUFFER_data(buf.get()), CRYPTO_BUFFER_len(buf.get()))"
                         ,"true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xa79,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
              testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_b8);
              testing::internal::AssertHelper::~AssertHelper(&local_58);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_a0._1_7_,local_a0[0]),
                                local_90._M_allocated_capacity + 1);
              }
              if (local_b8._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_b8._M_head_impl + 8))();
              }
            }
            if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_a8,local_a8);
            }
            orig_ptr._M_head_impl = local_68._M_head_impl;
            local_68._M_head_impl = (uchar *)0x0;
            if (orig_ptr._M_head_impl != (uchar *)0x0) {
              OPENSSL_free(orig_ptr._M_head_impl);
            }
            local_58.data_ = (AssertHelperData *)0x0;
            local_4c = i2d_X509(local_80._M_head_impl,(uint8_t **)&local_58);
            local_b0._M_head_impl = local_b0._M_head_impl & 0xffffffff00000000;
            testing::internal::CmpHelperGE<int,int>
                      ((internal *)local_a0,"i2d_len","0",&local_4c,(int *)&local_b0);
            if (local_a0[0] != (internal)0x0) {
              if (local_98 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_98,local_98);
              }
              local_38._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                   (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
                   (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
                   local_58.data_;
              bVar3 = PEMToDER((UniquePtr<uint8_t> *)&local_68,(size_t *)&local_60,
                               "\n-----BEGIN CERTIFICATE-----\nMIICXjCCAcegAwIBAgIIWjO48ufpunYwDQYJKoZIhvcNAQELBQAwNjEaMBgGA1UE\nChMRQm9yaW5nU1NMIFRFU1RJTkcxGDAWBgNVBAMTD0ludGVybWVkaWF0ZSBDQTAg\nFw0xNTAxMDEwMDAwMDBaGA8yMTAwMDEwMTAwMDAwMFowMjEaMBgGA1UEChMRQm9y\naW5nU1NMIFRFU1RJTkcxFDASBgNVBAMTC2V4YW1wbGUuY29tMIGfMA0GCSqGSIb3\nDQEBAQUAA4GNADCBiQKBgQDD0U0ZYgqShJ7oOjsyNKyVXEHqeafmk/bAoPqY/h1c\noPw2E8KmeqiUSoTPjG5IXSblOxcqpbAXgnjPzo8DI3GNMhAf8SYNYsoH7gc7Uy7j\n5x8bUrisGnuTHqkqH6d4/e7ETJ7i3CpR8bvK16DggEvQTudLipz8FBHtYhFakfdh\nTwIDAQABo3cwdTAOBgNVHQ8BAf8EBAMCBaAwHQYDVR0lBBYwFAYIKwYBBQUHAwEG\nCCsGAQUFBwMCMAwGA1UdEwEB/wQCMAAwGQYDVR0OBBIEEKN5pvbur7mlXjeMEYA0\n4nUwGwYDVR0jBBQwEoAQjBpoqLV2211Xex+NFLIGozANBgkqhkiG9w0BAQsFAAOB\ngQBj/p+JChp//LnXWC1k121LM/ii7hFzQzMrt70bny406SGz9jAjaPOX4S3gt38y\nrhjpPukBlSzgQXFg66y6q5qp1nQTD1Cw6NkKBe9WuBlY3iYfmsf7WT8nhlT1CttU\nxNCwyMX9mtdXdQicOfNjIGUCD5OLV5PgHFPRKiHHioBAhg==\n-----END CERTIFICATE-----\n"
                              );
              local_b0._M_head_impl._0_1_ = bVar3;
              local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (bVar3) {
LAB_003c5635:
                local_b0._M_head_impl = local_60._M_head_impl;
                testing::internal::CmpHelperEQ<long,int>
                          ((internal *)local_a0,"static_cast<long>(data2_len)","i2d_len",
                           (long *)&local_b0,&local_4c);
                if (local_a0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_b0);
                  if (local_98 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = (local_98->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_b8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0xa86,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_b8,(Message *)&local_b0);
LAB_003c5a97:
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
                  if ((X509 *)local_b0._M_head_impl != (X509 *)0x0) {
                    (**(code **)(*(long *)local_b0._M_head_impl + 8))();
                  }
                }
                else {
                  if (local_98 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_98,local_98);
                  }
                  local_b0._M_head_impl = local_b0._M_head_impl & 0xffffffff00000000;
                  if ((long)local_4c == 0) {
                    iVar4 = 0;
                  }
                  else {
                    iVar4 = memcmp(local_68._M_head_impl,local_58.data_,(long)local_4c);
                  }
                  local_b8._M_head_impl._0_4_ = iVar4;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_a0,"0","OPENSSL_memcmp(data2.get(), i2d, i2d_len)",
                             (int *)&local_b0,(int *)&local_b8);
                  if (local_a0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_b0);
                    if (local_98 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = (local_98->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0xa87,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b8,(Message *)&local_b0);
                    goto LAB_003c5a97;
                  }
                  if (local_98 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_98,local_98);
                  }
                  local_b0._M_head_impl =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((local_80._M_head_impl)->cert_info->enc).buf;
                  local_b8._M_head_impl =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x0;
                  testing::internal::CmpHelperEQ<crypto_buffer_st*,crypto_buffer_st*>
                            ((internal *)local_a0,"nullptr","root->cert_info->enc.buf",
                             (crypto_buffer_st **)&local_b8,(crypto_buffer_st **)&local_b0);
                  if (local_a0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_b0);
                    if (local_98 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = "";
                    }
                    else {
                      pcVar7 = (local_98->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0xa88,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b8,(Message *)&local_b0);
                    goto LAB_003c5a97;
                  }
                }
                if (local_98 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_98,local_98);
                }
              }
              else {
                testing::Message::Message((Message *)&local_b8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_a0,(internal *)&local_b0,
                           (AssertionResult *)"PEMToDER(&data2, &data2_len, kLeafPEM)","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_48,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xa84,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
                testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_48);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_a0._1_7_,local_a0[0]),
                                  local_90._M_allocated_capacity + 1);
                }
                if (local_b8._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_b8._M_head_impl + 8))();
                }
                if (local_a8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_a8,local_a8);
                }
                if (bVar3) goto LAB_003c5635;
              }
              std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_38);
              goto LAB_003c5904;
            }
            testing::Message::Message((Message *)&local_b0);
            if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar7 = "";
            }
            else {
              pcVar7 = (local_98->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0xa81,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_b8,(Message *)&local_b0);
          }
        }
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
        if ((X509 *)local_b0._M_head_impl != (X509 *)0x0) {
          (**(code **)(*(long *)local_b0._M_head_impl + 8))();
        }
        if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_98,local_98);
        }
      }
      else {
        testing::Message::Message((Message *)&local_b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a0,(internal *)&local_b0,
                   (AssertionResult *)"PEMToDER(&data2, &data2_len, kLeafPEM)","false","true",in_R9)
        ;
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xa66,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_a0._1_7_,local_a0[0]),local_90._M_allocated_capacity + 1
                         );
        }
        if (local_b8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_b8._M_head_impl + 8))();
        }
        if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a8,local_a8);
        }
        if (bVar3) goto LAB_003c5205;
      }
LAB_003c5904:
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_68);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_80);
  }
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_78);
LAB_003c5922:
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_40);
  return;
}

Assistant:

TEST(X509Test, TestFromBufferReused) {
  size_t data_len;
  bssl::UniquePtr<uint8_t> data;
  ASSERT_TRUE(PEMToDER(&data, &data_len, kRootCAPEM));

  bssl::UniquePtr<CRYPTO_BUFFER> buf(
      CRYPTO_BUFFER_new(data.get(), data_len, nullptr));
  ASSERT_TRUE(buf);

  bssl::UniquePtr<X509> root(X509_parse_from_buffer(buf.get()));
  ASSERT_TRUE(root);

  size_t data2_len;
  bssl::UniquePtr<uint8_t> data2;
  ASSERT_TRUE(PEMToDER(&data2, &data2_len, kLeafPEM));
  EXPECT_TRUE(buffers_alias(root->cert_info->enc.enc, root->cert_info->enc.len,
                            CRYPTO_BUFFER_data(buf.get()),
                            CRYPTO_BUFFER_len(buf.get())));

  // Historically, this function tested the interaction betweeen
  // |X509_parse_from_buffer| and object reuse. We no longer support object
  // reuse, so |d2i_X509| will replace |raw| with a new object. However, we
  // retain this test to verify that releasing objects from |d2i_X509| works
  // correctly.
  X509 *raw = root.release();
  const uint8_t *inp = data2.get();
  X509 *ret = d2i_X509(&raw, &inp, data2_len);
  root.reset(raw);

  ASSERT_EQ(root.get(), ret);
  ASSERT_EQ(nullptr, root->cert_info->enc.buf);
  EXPECT_FALSE(buffers_alias(root->cert_info->enc.enc, root->cert_info->enc.len,
                             CRYPTO_BUFFER_data(buf.get()),
                             CRYPTO_BUFFER_len(buf.get())));

  // Free |data2| and ensure that |root| took its own copy. Otherwise the
  // following will trigger a use-after-free.
  data2.reset();

  uint8_t *i2d = nullptr;
  int i2d_len = i2d_X509(root.get(), &i2d);
  ASSERT_GE(i2d_len, 0);
  bssl::UniquePtr<uint8_t> i2d_storage(i2d);

  ASSERT_TRUE(PEMToDER(&data2, &data2_len, kLeafPEM));

  ASSERT_EQ(static_cast<long>(data2_len), i2d_len);
  ASSERT_EQ(0, OPENSSL_memcmp(data2.get(), i2d, i2d_len));
  ASSERT_EQ(nullptr, root->cert_info->enc.buf);
}